

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

PropertySymOpnd * __thiscall
GlobOpt::CreateOpndForTypeCheckOnly(GlobOpt *this,PropertySymOpnd *opnd,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  undefined4 *puVar4;
  PropertySymOpnd *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  
  bVar2 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(opnd);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x35d,"(!opnd->IsRootObjectNonConfigurableFieldLoad())",
                       "!opnd->IsRootObjectNonConfigurableFieldLoad()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = IR::PropertySymOpnd::CopyCommon(opnd,func);
  IR::PropertySymOpnd::SetObjTypeSpecFldInfo(this_00,opnd->objTypeSpecFldInfo);
  IR::PropertySymOpnd::SetUsesAuxSlot
            (this_00,(bool)(opnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0 & opnd->field_0x61
                           ));
  uVar3 = IR::PropertySymOpnd::GetSlotIndex(opnd);
  IR::PropertySymOpnd::SetSlotIndex(this_00,uVar3);
  uVar3 = (opnd->field_12).objTypeSpecFlags;
  (this_00->field_12).objTypeSpecFlags = uVar3;
  *(byte *)&this_00->field_12 = ((byte)uVar3 & 0xfc) + 1;
  (this_00->finalType).t = (opnd->finalType).t;
  if (opnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew(opnd->guardedPropOps);
  }
  this_00->guardedPropOps = pBVar5;
  if (opnd->writeGuards == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew(opnd->writeGuards);
  }
  this_00->writeGuards = pBVar5;
  IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_00,true);
  return this_00;
}

Assistant:

IR::PropertySymOpnd *
GlobOpt::CreateOpndForTypeCheckOnly(IR::PropertySymOpnd* opnd, Func* func)
{
    // Used only for CheckObjType instruction today. Future users should make a call
    // whether the new operand is jit optimized in their scenario or not.

    Assert(!opnd->IsRootObjectNonConfigurableFieldLoad());
    IR::PropertySymOpnd *newOpnd = opnd->CopyCommon(func);

    newOpnd->SetObjTypeSpecFldInfo(opnd->GetObjTypeSpecInfo());
    newOpnd->SetUsesAuxSlot(opnd->UsesAuxSlot());
    newOpnd->SetSlotIndex(opnd->GetSlotIndex());

    newOpnd->objTypeSpecFlags = opnd->objTypeSpecFlags;
    // If we're turning the instruction owning this operand into a CheckObjType, we will do a type check here
    // only for the sake of downstream instructions, so the flags pertaining to this property access are
    // irrelevant, because we don't do a property access here.
    newOpnd->SetTypeCheckOnly(true);
    newOpnd->usesFixedValue = false;

    newOpnd->finalType = opnd->finalType;
    newOpnd->guardedPropOps = opnd->guardedPropOps != nullptr ? opnd->guardedPropOps->CopyNew() : nullptr;
    newOpnd->writeGuards = opnd->writeGuards != nullptr ? opnd->writeGuards->CopyNew() : nullptr;

    newOpnd->SetIsJITOptimizedReg(true);

    return newOpnd;
}